

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O0

void __thiscall pybind11::detail::function_record::function_record(function_record *this)

{
  void **local_18;
  function_record *this_local;
  
  this->name = (char *)0x0;
  this->doc = (char *)0x0;
  this->signature = (char *)0x0;
  std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  ::vector(&this->args);
  this->impl = (_func_handle_function_call_ptr *)0x0;
  local_18 = this->data;
  do {
    *local_18 = (void *)0x0;
    local_18 = local_18 + 1;
  } while ((_func_void_function_record_ptr **)local_18 != &this->free_data);
  this->free_data = (_func_void_function_record_ptr *)0x0;
  this->policy = automatic;
  this->field_0x59 = this->field_0x59 & 0xfe;
  this->field_0x59 = this->field_0x59 & 0xfd;
  this->field_0x59 = this->field_0x59 & 0xfb;
  this->field_0x59 = this->field_0x59 & 0xf7;
  this->field_0x59 = this->field_0x59 & 0xef;
  this->field_0x59 = this->field_0x59 & 0xdf;
  this->field_0x59 = this->field_0x59 & 0xbf;
  this->field_0x59 = this->field_0x59 & 0x7f;
  this->nargs_pos = 0;
  this->nargs_pos_only = 0;
  this->def = (PyMethodDef *)0x0;
  handle::handle(&this->scope);
  handle::handle(&this->sibling);
  this->next = (function_record *)0x0;
  return;
}

Assistant:

function_record()
        : is_constructor(false), is_new_style_constructor(false), is_stateless(false),
          is_operator(false), is_method(false), has_args(false), has_kwargs(false),
          prepend(false) {}